

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

Document * __thiscall svg::Document::toString_abi_cxx11_(Document *this)

{
  ostream *poVar1;
  long in_RSI;
  allocator local_491;
  string local_490 [32];
  svg local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  svg local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [32];
  svg local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  svg local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  svg local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  svg local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  svg local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  Document *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"<?xml ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"version",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"",&local_219);
  attribute<char[4]>(local_1d0,(string *)local_1f0,(char (*) [4])"1.0",(string *)local_218);
  poVar1 = std::operator<<(poVar1,(string *)local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"standalone",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"",&local_289);
  attribute<char[3]>(local_240,(string *)local_260,(char (*) [3])"no",(string *)local_288);
  poVar1 = std::operator<<(poVar1,(string *)local_240);
  poVar1 = std::operator<<(poVar1,"?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ");
  poVar1 = std::operator<<(poVar1,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"width",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"px",&local_2f9);
  attribute<double>(local_2b0,(string *)local_2d0,(double *)(in_RSI + 0x20),(string *)local_2f8);
  poVar1 = std::operator<<(poVar1,(string *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"height",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"px",&local_369);
  attribute<double>(local_320,(string *)local_340,(double *)(in_RSI + 0x28),(string *)local_368);
  poVar1 = std::operator<<(poVar1,(string *)local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"xmlns",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"",&local_3d9);
  attribute<char[27]>(local_390,(string *)local_3b0,(char (*) [27])"http://www.w3.org/2000/svg",
                      (string *)local_3d8);
  poVar1 = std::operator<<(poVar1,(string *)local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"version",&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"",&local_449);
  attribute<char[4]>(local_400,(string *)local_420,(char (*) [4])"1.1",(string *)local_448);
  poVar1 = std::operator<<(poVar1,(string *)local_400);
  poVar1 = std::operator<<(poVar1,">\n");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"svg",&local_491);
  elemEnd(local_470,(string *)local_490);
  std::operator<<(poVar1,(string *)local_470);
  std::__cxx11::string::~string((string *)local_470);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string((string *)local_400);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)local_390);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string toString() const
        {
            std::stringstream ss;
            ss << "<?xml " << attribute("version", "1.0") << attribute("standalone", "no")
                << "?>\n<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
                << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">\n<svg "
                << attribute("width", layout.dimensions.width, "px")
                << attribute("height", layout.dimensions.height, "px")
                << attribute("xmlns", "http://www.w3.org/2000/svg")
                << attribute("version", "1.1") << ">\n" << body_nodes_str << elemEnd("svg");
            return ss.str();
        }